

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O0

void test_drawonable_fns(void)

{
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar1;
  Am_Style *arg6;
  undefined8 in_stack_ffffffffffffff90;
  uint uVar2;
  Am_Style *arg7;
  Am_Style local_60 [8];
  Am_Style local_58 [8];
  Am_Style local_50 [8];
  Am_Style local_48 [8];
  Am_Style local_40 [8];
  Am_Style local_38 [24];
  Am_Style local_20 [8];
  Am_Style local_18 [12];
  int local_c;
  int counter;
  
  uVar1 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  uVar2 = (uint)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  printf("Testing higher-level Am_Drawonable member functions:\n");
  printf("  Hit RETURN to clip black rect to drawonable\'s clip_region\n");
  getchar();
  (**(code **)(*(long *)d1 + 0xe8))();
  clear_whole_window(d1);
  (**(code **)(*(long *)d1 + 0xf8))(d1,0x96,0x32,0x50,0x28);
  (**(code **)(*(long *)d1 + 0x160))
            (d1,&Am_No_Style,&black,0,0,300,CONCAT44(uVar1,200),(ulong)uVar2 << 0x20);
  (**(code **)(*(long *)d1 + 0xa0))();
  printf("  Hit RETURN 6 times to nest Am_Drawonable clipping:  ");
  Am_Style::Am_Style(local_18,(Am_Style *)&red);
  Am_Style::Am_Style(local_20,(Am_Style *)&green);
  Am_Style::Am_Style(local_38,(Am_Style *)&blue);
  Am_Style::Am_Style(local_40,(Am_Style *)&white);
  Am_Style::Am_Style(local_48,(Am_Style *)&black);
  Am_Style::Am_Style(local_50,(Am_Style *)&yellow);
  Am_Style::Am_Style(local_58,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_60,(Am_Style *)&Am_No_Style);
  arg7 = local_60;
  arg6 = local_58;
  set_style_array(local_18,local_20,local_38,local_40,local_48,local_50,arg6,arg7);
  Am_Style::~Am_Style(local_60);
  Am_Style::~Am_Style(local_58);
  Am_Style::~Am_Style(local_50);
  Am_Style::~Am_Style(local_48);
  Am_Style::~Am_Style(local_40);
  Am_Style::~Am_Style(local_38);
  Am_Style::~Am_Style(local_20);
  Am_Style::~Am_Style(local_18);
  (**(code **)(*(long *)d1 + 0xe8))();
  clear_whole_window(d1);
  for (local_c = 0; uVar1 = (undefined4)((ulong)arg6 >> 0x20), local_c < 6; local_c = local_c + 1) {
    getchar();
    printf("%d  ",(ulong)(local_c + 1));
    (**(code **)(*(long *)d1 + 0x108))(d1,local_c * 10 + 10,local_c * 10 + 10,0x96);
    arg6 = (Am_Style *)CONCAT44(uVar1,200);
    arg7 = (Am_Style *)((ulong)arg7 & 0xffffffff00000000);
    (**(code **)(*(long *)d1 + 0x160))
              (d1,&Am_No_Style,style_array + (long)local_c * 8,0,0,300,arg6,arg7);
    (**(code **)(*(long *)d1 + 0xa0))();
  }
  printf("\n");
  printf("  Hit RETURN 6 times to pop Am_Drawonable clipping:  ");
  for (local_c = 0; uVar1 = (undefined4)((ulong)arg6 >> 0x20), local_c < 6; local_c = local_c + 1) {
    getchar();
    printf("%d  ",(ulong)(local_c + 1));
    (**(code **)(*(long *)d1 + 0x110))();
    arg6 = (Am_Style *)CONCAT44(uVar1,200);
    arg7 = (Am_Style *)((ulong)arg7 & 0xffffffff00000000);
    (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,&purple,0,0,300,arg6,arg7);
    (**(code **)(*(long *)d1 + 0xa0))();
  }
  printf("\n");
  printf("  Hit RETURN 2 times to push again into that same Am_Drawonable:  ");
  for (local_c = 0; uVar1 = (undefined4)((ulong)arg6 >> 0x20), local_c < 2; local_c = local_c + 1) {
    getchar();
    printf("%d  ",(ulong)(local_c + 1));
    (**(code **)(*(long *)d1 + 0x108))(d1,local_c * 10 + 0x32,local_c * 10 + 0x32,200,0x32);
    arg6 = (Am_Style *)CONCAT44(uVar1,200);
    arg7 = (Am_Style *)((ulong)arg7 & 0xffffffff00000000);
    (**(code **)(*(long *)d1 + 0x160))
              (d1,&Am_No_Style,style_array + (long)local_c * 8,0,0,300,arg6,arg7);
    (**(code **)(*(long *)d1 + 0xa0))();
  }
  printf("\n");
  return;
}

Assistant:

void
test_drawonable_fns()
{
  printf("Testing higher-level Am_Drawonable member functions:\n");

  printf("  Hit RETURN to clip black rect to drawonable's clip_region\n");
  getchar();

  d1->Clear_Clip();
  clear_whole_window(d1);
  ;
  d1->Set_Clip(150, 50, 80, 40);
  d1->Draw_Rectangle(Am_No_Style, black, 0, 0, 300, 200);
  d1->Flush_Output();

  int counter;
  printf("  Hit RETURN 6 times to nest Am_Drawonable clipping:  ");
  set_style_array(red, green, blue, white, black, yellow);
  d1->Clear_Clip();
  clear_whole_window(d1);
  ;

  for (counter = 0; counter <= 5; counter++) {
    getchar();
    printf("%d  ", counter + 1);
    d1->Push_Clip(10 + 10 * counter, 10 + 10 * counter, 150, 150);
    d1->Draw_Rectangle(Am_No_Style, style_array[counter], 0, 0, 300, 200);
    d1->Flush_Output();
  }
  printf("\n");

  printf("  Hit RETURN 6 times to pop Am_Drawonable clipping:  ");
  for (counter = 0; counter <= 5; counter++) {
    getchar();
    printf("%d  ", counter + 1);
    d1->Pop_Clip();
    d1->Draw_Rectangle(Am_No_Style, purple, 0, 0, 300, 200);
    d1->Flush_Output();
  }
  printf("\n");

  printf("  Hit RETURN 2 times to push again into that same Am_Drawonable:  ");
  for (counter = 0; counter <= 1; counter++) {
    getchar();
    printf("%d  ", counter + 1);
    d1->Push_Clip(50 + 10 * counter, 50 + 10 * counter, 200, 50);
    d1->Draw_Rectangle(Am_No_Style, style_array[counter], 0, 0, 300, 200);
    d1->Flush_Output();
  }
  printf("\n");
}